

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

void __thiscall
AssemblyCode::CJumpLessCommand::CJumpLessCommand
          (CJumpLessCommand *this,CTemp *leftOperand,CTemp *rightOperand,string *label)

{
  string *label_local;
  CTemp *rightOperand_local;
  CTemp *leftOperand_local;
  CJumpLessCommand *this_local;
  
  AbstractJumpCommand::AbstractJumpCommand(&this->super_AbstractJumpCommand,label);
  (this->super_AbstractJumpCommand).super_AssemblyCommand._vptr_AssemblyCommand =
       (_func_int **)&PTR_GetIn_00239e10;
  IRT::CTemp::CTemp(&this->leftOperand,leftOperand);
  IRT::CTemp::CTemp(&this->rightOperand,rightOperand);
  return;
}

Assistant:

AssemblyCode::CJumpLessCommand::CJumpLessCommand( const IRT::CTemp leftOperand, const IRT::CTemp rightOperand,
                                                  const std::string &label ) : AbstractJumpCommand( label ),
                                                                               leftOperand( leftOperand ),
                                                                               rightOperand( rightOperand ) { }